

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O0

void __thiscall FDrawInfo::ClearFloodStencil(FDrawInfo *this,wallseg *ws)

{
  undefined1 local_40 [8];
  FQuadDrawer qd;
  ScopedColorMask local_20;
  int local_1c;
  ScopedColorMask colorMask;
  int recursion;
  wallseg *ws_local;
  FDrawInfo *this_local;
  
  _colorMask = ws;
  local_1c = GLPortal::GetRecursion();
  (*_ptrc_glStencilOp)(0x1e00,0x1e00,0x1e03);
  FRenderState::EnableTexture(&gl_RenderState,false);
  ScopedColorMask::ScopedColorMask(&local_20,false,false,false,false);
  FRenderState::ResetColor(&gl_RenderState);
  FRenderState::Apply(&gl_RenderState);
  FQuadDrawer::FQuadDrawer((FQuadDrawer *)local_40);
  FQuadDrawer::Set((FQuadDrawer *)local_40,0,_colorMask->x1,_colorMask->z1,_colorMask->y1,0.0,0.0);
  FQuadDrawer::Set((FQuadDrawer *)local_40,1,_colorMask->x1,_colorMask->z2,_colorMask->y1,0.0,0.0);
  FQuadDrawer::Set((FQuadDrawer *)local_40,2,_colorMask->x2,_colorMask->z2,_colorMask->y2,0.0,0.0);
  FQuadDrawer::Set((FQuadDrawer *)local_40,3,_colorMask->x2,_colorMask->z1,_colorMask->y2,0.0,0.0);
  FQuadDrawer::Render((FQuadDrawer *)local_40,6);
  (*_ptrc_glStencilOp)(0x1e00,0x1e00,0x1e00);
  (*_ptrc_glStencilFunc)(0x202,local_1c,0xffffffff);
  FRenderState::EnableTexture(&gl_RenderState,true);
  ScopedColorMask::~ScopedColorMask(&local_20);
  (*_ptrc_glEnable)(0xb71);
  (*_ptrc_glDepthMask)('\x01');
  return;
}

Assistant:

void FDrawInfo::ClearFloodStencil(wallseg * ws)
{
	int recursion = GLPortal::GetRecursion();

	glStencilOp(GL_KEEP,GL_KEEP,GL_DECR);
	gl_RenderState.EnableTexture(false);
	{
		// Use revertible color mask, to avoid stomping on anaglyph 3D state
		ScopedColorMask colorMask(0, 0, 0, 0); // glColorMask(0,0,0,0);						// don't write to the graphics buffer
		gl_RenderState.ResetColor();

		gl_RenderState.Apply();
		FQuadDrawer qd;
		qd.Set(0, ws->x1, ws->z1, ws->y1, 0, 0);
		qd.Set(1, ws->x1, ws->z2, ws->y1, 0, 0);
		qd.Set(2, ws->x2, ws->z2, ws->y2, 0, 0);
		qd.Set(3, ws->x2, ws->z1, ws->y2, 0, 0);
		qd.Render(GL_TRIANGLE_FAN);

		// restore old stencil op.
		glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
		glStencilFunc(GL_EQUAL, recursion, ~0);
		gl_RenderState.EnableTexture(true);
	} // glColorMask(1, 1, 1, 1);
	glEnable(GL_DEPTH_TEST);
	glDepthMask(true);
}